

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile.c
# Opt level: O3

LY_ERR lys_compile_unres_check_disabled(lysc_node *node)

{
  LY_ERR LVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  char *pcVar6;
  lysc_node *plVar7;
  ulong uVar8;
  
  if ((node->flags & 0x100) == 0) {
    for (plVar7 = node->parent; plVar7 != (lysc_node *)0x0; plVar7 = plVar7->parent) {
      if (plVar7->nodetype == 0x10) {
        pcVar6 = plVar7[1].name;
        uVar8 = 0;
        while( true ) {
          if (pcVar6 == (char *)0x0) {
            uVar5 = 0;
          }
          else {
            uVar5 = *(ulong *)(pcVar6 + -8);
          }
          if (uVar5 <= uVar8) break;
          lVar4 = *(long *)(pcVar6 + uVar8 * 8);
          uVar5 = 0;
          while( true ) {
            if (lVar4 == 0) {
              uVar3 = 0;
            }
            else {
              uVar3 = *(ulong *)(lVar4 + -8);
            }
            if (uVar3 <= uVar5) break;
            if (*(lysc_node **)(lVar4 + uVar5 * 8) == node) {
              uVar3 = *(ulong *)(lVar4 + -8);
              if (1 < uVar3) {
                uVar2 = uVar3 - 1;
                if (uVar5 < uVar2) {
                  memmove((void *)(lVar4 + uVar5 * 8),(void *)(lVar4 + uVar5 * 8 + 8),
                          (uVar3 - uVar5) * 8 - 8);
                  lVar4 = *(long *)(plVar7[1].name + uVar8 * 8);
                  uVar2 = *(long *)(lVar4 + -8) - 1;
                }
                *(ulong *)(lVar4 + -8) = uVar2;
                goto LAB_00143eb1;
              }
              free((ulong *)(lVar4 + -8));
              pcVar6 = plVar7[1].name;
              if (pcVar6 != (char *)0x0) {
                uVar5 = *(ulong *)(pcVar6 + -8);
                if (1 < uVar5) {
                  uVar3 = uVar5 - 1;
                  if (uVar8 < uVar3) {
                    memmove(pcVar6 + uVar8 * 8,pcVar6 + uVar8 * 8 + 8,(uVar5 + ~uVar8) * 8);
                    pcVar6 = plVar7[1].name;
                    uVar3 = *(long *)(pcVar6 + -8) - 1;
                  }
                  *(ulong *)(pcVar6 + -8) = uVar3;
                  goto LAB_00143eb1;
                }
                free(pcVar6 + -8);
              }
              plVar7[1].name = (char *)0x0;
              goto LAB_00143eb1;
            }
            uVar5 = uVar5 + 1;
          }
          uVar8 = uVar8 + 1;
        }
      }
LAB_00143eb1:
    }
    LVar1 = LY_SUCCESS;
  }
  else {
    ly_log_location(node,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
    ly_vlog(node->module->ctx,(char *)0x0,LYVE_REFERENCE,"Key \"%s\" is disabled.",node->name);
    ly_log_location_revert(1,0,0,0);
    LVar1 = LY_EVALID;
  }
  return LVar1;
}

Assistant:

static LY_ERR
lys_compile_unres_check_disabled(const struct lysc_node *node)
{
    const struct lysc_node *parent;
    struct lysc_node_list *slist;
    LY_ARRAY_COUNT_TYPE u, v;
    int found;

    if (node->flags & LYS_KEY) {
        LOG_LOCSET(node, NULL);
        LOGVAL(node->module->ctx, LYVE_REFERENCE, "Key \"%s\" is disabled.", node->name);
        LOG_LOCBACK(1, 0);
        return LY_EVALID;
    }

    for (parent = node->parent; parent; parent = parent->parent) {
        if (parent->nodetype != LYS_LIST) {
            continue;
        }

        /* check and fix list uniques */
        slist = (struct lysc_node_list *)parent;
        found = 0;
        LY_ARRAY_FOR(slist->uniques, u) {
            LY_ARRAY_FOR(slist->uniques[u], v) {
                if (slist->uniques[u][v] == (struct lysc_node_leaf *)node) {
                    found = 1;
                    break;
                }
            }

            if (found) {
                break;
            }
        }

        if (found) {
            if (LY_ARRAY_COUNT(slist->uniques[u]) > 1) {
                /* remove the item */
                if (v < LY_ARRAY_COUNT(slist->uniques[u]) - 1) {
                    memmove(&slist->uniques[u][v], &slist->uniques[u][v + 1],
                            (LY_ARRAY_COUNT(slist->uniques[u]) - v - 1) * sizeof slist->uniques[u][v]);
                }
                LY_ARRAY_DECREMENT(slist->uniques[u]);
            } else {
                /* remove the whole unique array */
                LY_ARRAY_FREE(slist->uniques[u]);
                if (LY_ARRAY_COUNT(slist->uniques) > 1) {
                    if (u < LY_ARRAY_COUNT(slist->uniques) - 1) {
                        memmove(&slist->uniques[u], &slist->uniques[u + 1],
                                (LY_ARRAY_COUNT(slist->uniques) - u - 1) * sizeof slist->uniques[u]);
                    }
                    LY_ARRAY_DECREMENT(slist->uniques);
                } else {
                    LY_ARRAY_FREE(slist->uniques);
                    slist->uniques = NULL;
                }
            }
        }
    }

    return LY_SUCCESS;
}